

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

void __thiscall sentencepiece::TrainerSpec::Clear(TrainerSpec *this)

{
  uint uVar1;
  long in_RDI;
  uint32 cached_has_bits;
  ExtensionSet *in_stack_ffffffffffffff80;
  LazyString *in_stack_ffffffffffffff88;
  ArenaStringPtr *in_stack_ffffffffffffff90;
  
  google::protobuf::internal::ExtensionSet::Clear(in_stack_ffffffffffffff80);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x454d05);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x454d13);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x454d21);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x454d32);
  uVar1 = *(uint *)(in_RDI + 0x28);
  if ((uVar1 & 0xff) != 0) {
    if ((uVar1 & 1) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty((ArenaStringPtr *)0x454d88)
      ;
    }
    if ((uVar1 & 2) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty((ArenaStringPtr *)0x454da5)
      ;
    }
    if ((uVar1 & 4) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty((ArenaStringPtr *)0x454dc2)
      ;
    }
    if ((uVar1 & 8) != 0) {
      google::protobuf::MessageLite::GetArena((MessageLite *)in_stack_ffffffffffffff80);
      google::protobuf::internal::ArenaStringPtr::ClearToDefault
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 (Arena *)in_stack_ffffffffffffff80);
    }
    if ((uVar1 & 0x10) != 0) {
      google::protobuf::MessageLite::GetArena((MessageLite *)in_stack_ffffffffffffff80);
      google::protobuf::internal::ArenaStringPtr::ClearToDefault
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 (Arena *)in_stack_ffffffffffffff80);
    }
    if ((uVar1 & 0x20) != 0) {
      in_stack_ffffffffffffff90 = (ArenaStringPtr *)(in_RDI + 0xc0);
      google::protobuf::MessageLite::GetArena((MessageLite *)in_stack_ffffffffffffff80);
      google::protobuf::internal::ArenaStringPtr::ClearToDefault
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 (Arena *)in_stack_ffffffffffffff80);
    }
    if ((uVar1 & 0x40) != 0) {
      in_stack_ffffffffffffff88 = (LazyString *)(in_RDI + 200);
      google::protobuf::MessageLite::GetArena((MessageLite *)in_stack_ffffffffffffff80);
      google::protobuf::internal::ArenaStringPtr::ClearToDefault
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 (Arena *)in_stack_ffffffffffffff80);
    }
    if ((uVar1 & 0x80) != 0) {
      in_stack_ffffffffffffff80 = (ExtensionSet *)(in_RDI + 0xd0);
      google::protobuf::MessageLite::GetArena((MessageLite *)in_stack_ffffffffffffff80);
      google::protobuf::internal::ArenaStringPtr::ClearToDefault
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 (Arena *)in_stack_ffffffffffffff80);
    }
  }
  if ((uVar1 & 0x300) != 0) {
    if ((uVar1 & 0x100) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty((ArenaStringPtr *)0x454f0b)
      ;
    }
    if ((uVar1 & 0x200) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty((ArenaStringPtr *)0x454f2a)
      ;
    }
  }
  if ((uVar1 & 0xfc00) != 0) {
    memset((void *)(in_RDI + 0xe8),0,0x16);
  }
  if ((uVar1 & 0xff0000) != 0) {
    memset((void *)(in_RDI + 0xfe),0,0x1a);
  }
  if ((uVar1 & 0xff000000) != 0) {
    *(undefined4 *)(in_RDI + 0x118) = 1;
    *(undefined4 *)(in_RDI + 0x11c) = 8000;
    *(undefined4 *)(in_RDI + 0x120) = 0x3f7fdf3b;
    *(undefined4 *)(in_RDI + 0x124) = 1000000;
    *(undefined4 *)(in_RDI + 0x128) = 0x3f400000;
    *(undefined4 *)(in_RDI + 300) = 0x10;
    *(undefined4 *)(in_RDI + 0x130) = 2;
    *(undefined4 *)(in_RDI + 0x134) = 0x1060;
  }
  if ((*(uint *)(in_RDI + 0x2c) & 0xff) != 0) {
    *(undefined4 *)(in_RDI + 0x138) = 0x10;
    *(undefined1 *)(in_RDI + 0x13c) = 1;
    *(undefined1 *)(in_RDI + 0x13d) = 1;
    *(undefined1 *)(in_RDI + 0x13e) = 1;
    *(undefined1 *)(in_RDI + 0x13f) = 1;
    *(undefined1 *)(in_RDI + 0x140) = 1;
    *(undefined1 *)(in_RDI + 0x141) = 1;
    *(undefined4 *)(in_RDI + 0x144) = 1;
  }
  if ((*(uint *)(in_RDI + 0x2c) & 0x300) != 0) {
    *(undefined4 *)(in_RDI + 0x148) = 2;
    *(undefined4 *)(in_RDI + 0x14c) = 0xffffffff;
  }
  memset((void *)(in_RDI + 0x28),0,8);
  if (((uint)*(undefined8 *)(in_RDI + 8) & 1) == 1) {
    google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
              ((InternalMetadata *)in_stack_ffffffffffffff80);
  }
  return;
}

Assistant:

void TrainerSpec::Clear() {
// @@protoc_insertion_point(message_clear_start:sentencepiece.TrainerSpec)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _extensions_.Clear();
  input_.Clear();
  accept_language_.Clear();
  control_symbols_.Clear();
  user_defined_symbols_.Clear();
  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x000000ffu) {
    if (cached_has_bits & 0x00000001u) {
      model_prefix_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000002u) {
      input_format_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000004u) {
      required_chars_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000008u) {
      unk_surface_.ClearToDefault(::sentencepiece::TrainerSpec::_i_give_permission_to_break_this_code_default_unk_surface_, GetArena());
       }
    if (cached_has_bits & 0x00000010u) {
      unk_piece_.ClearToDefault(::sentencepiece::TrainerSpec::_i_give_permission_to_break_this_code_default_unk_piece_, GetArena());
       }
    if (cached_has_bits & 0x00000020u) {
      bos_piece_.ClearToDefault(::sentencepiece::TrainerSpec::_i_give_permission_to_break_this_code_default_bos_piece_, GetArena());
       }
    if (cached_has_bits & 0x00000040u) {
      eos_piece_.ClearToDefault(::sentencepiece::TrainerSpec::_i_give_permission_to_break_this_code_default_eos_piece_, GetArena());
       }
    if (cached_has_bits & 0x00000080u) {
      pad_piece_.ClearToDefault(::sentencepiece::TrainerSpec::_i_give_permission_to_break_this_code_default_pad_piece_, GetArena());
       }
  }
  if (cached_has_bits & 0x00000300u) {
    if (cached_has_bits & 0x00000100u) {
      pretokenization_delimiter_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000200u) {
      seed_sentencepieces_file_.ClearNonDefaultToEmpty();
    }
  }
  if (cached_has_bits & 0x0000fc00u) {
    ::memset(&self_test_sample_size_, 0, static_cast<size_t>(
        reinterpret_cast<char*>(&treat_whitespace_as_suffix_) -
        reinterpret_cast<char*>(&self_test_sample_size_)) + sizeof(treat_whitespace_as_suffix_));
  }
  if (cached_has_bits & 0x00ff0000u) {
    ::memset(&allow_whitespace_only_pieces_, 0, static_cast<size_t>(
        reinterpret_cast<char*>(&differential_privacy_clipping_threshold_) -
        reinterpret_cast<char*>(&allow_whitespace_only_pieces_)) + sizeof(differential_privacy_clipping_threshold_));
  }
  if (cached_has_bits & 0xff000000u) {
    model_type_ = 1;
    vocab_size_ = 8000;
    character_coverage_ = 0.9995f;
    seed_sentencepiece_size_ = 1000000;
    shrinking_factor_ = 0.75f;
    num_threads_ = 16;
    num_sub_iterations_ = 2;
    max_sentence_length_ = 4192;
  }
  cached_has_bits = _has_bits_[1];
  if (cached_has_bits & 0x000000ffu) {
    max_sentencepiece_length_ = 16;
    shuffle_input_sentence_ = true;
    split_by_unicode_script_ = true;
    split_by_number_ = true;
    split_by_whitespace_ = true;
    vocabulary_output_piece_score_ = true;
    hard_vocab_limit_ = true;
    bos_id_ = 1;
  }
  if (cached_has_bits & 0x00000300u) {
    eos_id_ = 2;
    pad_id_ = -1;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear<std::string>();
}